

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcemanager.cpp
# Opt level: O2

GLuint __thiscall
ResourceManager::getShader(ResourceManager *this,string *vtShader,string *fragShader,bool *succes)

{
  iterator iVar1;
  _Rb_tree_color _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string shaderKey;
  
  std::operator+(&local_70,vtShader,",");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 &local_70,fragShader);
  std::__cxx11::string::~string((string *)&local_70);
  *succes = false;
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::find(&(this->loadedShaders)._M_t,(key_type *)local_50);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->loadedShaders)._M_t._M_impl.super__Rb_tree_header)
  {
    _Var2 = ~_S_red;
  }
  else {
    *succes = true;
    _Var2 = iVar1._M_node[2]._M_color;
  }
  std::__cxx11::string::~string((string *)local_50);
  return _Var2;
}

Assistant:

GLuint ResourceManager::getShader(std::string vtShader, std::string fragShader, bool& succes)
{
	std::string shaderKey = vtShader + "," + fragShader;
	succes = false;
	std::map<std::string, GLuint>::iterator it;
	it = loadedShaders.find(shaderKey);
	if (it == loadedShaders.end())
	{
		return -1;
	}
	else
	{
		succes = true;
		return it->second;
	}
}